

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_req.cc
# Opt level: O1

int rinf_cb(int operation,ASN1_VALUE **pval,ASN1_ITEM *it,void *exarg)

{
  ASN1_VALUE *pAVar1;
  OPENSSL_STACK *pOVar2;
  ulong uVar3;
  int iVar4;
  
  pAVar1 = *pval;
  iVar4 = 1;
  if (operation == 5) {
    uVar3 = ASN1_INTEGER_get(*(ASN1_INTEGER **)(pAVar1 + 0x18));
    if ((uVar3 & 0xfffffffffffffffd) != 0) {
      iVar4 = 0;
      ERR_put_error(0xb,0,0x8c,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_req.cc"
                    ,0x30);
    }
  }
  else if (operation == 1) {
    pOVar2 = OPENSSL_sk_new_null();
    *(OPENSSL_STACK **)(pAVar1 + 0x30) = pOVar2;
    if (pOVar2 == (OPENSSL_STACK *)0x0) {
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

static int rinf_cb(int operation, ASN1_VALUE **pval, const ASN1_ITEM *it,
                   void *exarg) {
  X509_REQ_INFO *rinf = (X509_REQ_INFO *)*pval;

  if (operation == ASN1_OP_NEW_POST) {
    rinf->attributes = sk_X509_ATTRIBUTE_new_null();
    if (!rinf->attributes) {
      return 0;
    }
  }

  if (operation == ASN1_OP_D2I_POST) {
    // The only defined CSR version is v1(0). For compatibility, we also accept
    // a hypothetical v3(2). Although not defined, older versions of certbot
    // use it. See https://github.com/certbot/certbot/pull/9334.
    long version = ASN1_INTEGER_get(rinf->version);
    if (version != X509_REQ_VERSION_1 && version != 2) {
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_VERSION);
      return 0;
    }
  }

  return 1;
}